

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O2

void __thiscall iqnet::ssl::Ctx::Ctx(Ctx *this,string *cert_path,string *key_path,bool client)

{
  int iVar1;
  Impl *p;
  SSL_METHOD *meth;
  SSL_CTX *pSVar2;
  type pIVar3;
  exception *this_00;
  
  p = (Impl *)operator_new(0x20);
  p->server_verifier = (ConnectionVerifier *)0x0;
  p->client_verifier = (ConnectionVerifier *)0x0;
  p->require_client_cert = false;
  boost::shared_ptr<iqnet::ssl::Ctx::Impl>::shared_ptr<iqnet::ssl::Ctx::Impl>(&this->impl_,p);
  boost::call_once<void(&)()>((once_flag *)&ssl_init,init_library);
  if (client) {
    meth = (SSL_METHOD *)TLS_method();
  }
  else {
    meth = (SSL_METHOD *)TLS_server_method();
  }
  pSVar2 = SSL_CTX_new(meth);
  pIVar3 = boost::shared_ptr<iqnet::ssl::Ctx::Impl>::operator->(&this->impl_);
  pIVar3->ctx = (SSL_CTX *)pSVar2;
  pIVar3 = boost::shared_ptr<iqnet::ssl::Ctx::Impl>::operator->(&this->impl_);
  anon_unknown_9::set_common_options(pIVar3->ctx);
  pIVar3 = boost::shared_ptr<iqnet::ssl::Ctx::Impl>::operator->(&this->impl_);
  iVar1 = SSL_CTX_use_certificate_file((SSL_CTX *)pIVar3->ctx,(cert_path->_M_dataplus)._M_p,1);
  if (iVar1 != 0) {
    pIVar3 = boost::shared_ptr<iqnet::ssl::Ctx::Impl>::operator->(&this->impl_);
    iVar1 = SSL_CTX_use_PrivateKey_file((SSL_CTX *)pIVar3->ctx,(key_path->_M_dataplus)._M_p,1);
    if (iVar1 != 0) {
      pIVar3 = boost::shared_ptr<iqnet::ssl::Ctx::Impl>::operator->(&this->impl_);
      iVar1 = SSL_CTX_check_private_key((SSL_CTX *)pIVar3->ctx);
      if (iVar1 != 0) {
        return;
      }
    }
  }
  this_00 = (exception *)__cxa_allocate_exception(0x30);
  exception::exception(this_00);
  __cxa_throw(this_00,&exception::typeinfo,exception::~exception);
}

Assistant:

Ctx::Ctx( const std::string& cert_path, const std::string& key_path, bool client ):
  impl_(new Impl)
{
  boost::call_once(ssl_init, init_library);
  impl_->ctx = SSL_CTX_new( client ? SSLv23_method() : SSLv23_server_method() );
  set_common_options(impl_->ctx);

  if(
    !SSL_CTX_use_certificate_file( impl_->ctx, cert_path.c_str(), SSL_FILETYPE_PEM ) ||
    !SSL_CTX_use_PrivateKey_file( impl_->ctx, key_path.c_str(), SSL_FILETYPE_PEM ) ||
    !SSL_CTX_check_private_key( impl_->ctx )
  )
    throw exception();
}